

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

deUint32 vkt::api::anon_unknown_1::getSafeObjectCount<vkt::api::(anonymous_namespace)::BufferView>
                   (Context *context,Parameters *params,deUint32 hardCountLimit,
                   VkDeviceSize deviceMemoryUsage)

{
  size_t sVar1;
  unsigned_long uVar2;
  VkDeviceSize deviceMemoryUsage_local;
  deUint32 hardCountLimit_local;
  Parameters *params_local;
  Context *context_local;
  
  sVar1 = computeSystemMemoryUsage<vkt::api::(anonymous_namespace)::BufferView>(context,params);
  sVar1 = getSafeObjectCount(context,sVar1,deviceMemoryUsage);
  uVar2 = de::min<unsigned_long>((ulong)hardCountLimit,sVar1);
  return (deUint32)uVar2;
}

Assistant:

deUint32 getSafeObjectCount (Context&							context,
							 const typename Object::Parameters&	params,
							 deUint32							hardCountLimit,
							 VkDeviceSize						deviceMemoryUsage = 0)
{
	return (deUint32)de::min((size_t)hardCountLimit,
							 getSafeObjectCount(context,
												computeSystemMemoryUsage<Object>(context, params),
												deviceMemoryUsage));
}